

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

boolean get_interesting_appn(j_decompress_ptr cinfo)

{
  byte bVar1;
  int iVar2;
  jpeg_source_mgr *pjVar3;
  boolean bVar4;
  uint uVar5;
  jpeg_error_mgr *pjVar6;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  j_decompress_ptr pjVar12;
  size_t sVar13;
  byte *pbVar14;
  uint uVar15;
  JOCTET b [14];
  undefined4 local_58;
  char local_54;
  undefined2 local_53;
  byte local_51;
  byte bStack_50;
  byte bStack_4f;
  byte bStack_4e;
  byte bStack_4d;
  byte local_4c;
  byte local_4b;
  long local_48;
  j_decompress_ptr local_40;
  ulong local_38;
  
  pjVar3 = cinfo->src;
  sVar13 = pjVar3->bytes_in_buffer;
  local_40 = cinfo;
  if (sVar13 == 0) {
    bVar4 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar4 == 0) {
      return 0;
    }
    sVar13 = pjVar3->bytes_in_buffer;
  }
  bVar1 = *pjVar3->next_input_byte;
  sVar13 = sVar13 - 1;
  if (sVar13 == 0) {
    bVar4 = (*pjVar3->fill_input_buffer)(local_40);
    if (bVar4 == 0) {
      return 0;
    }
    pbVar14 = pjVar3->next_input_byte;
    sVar13 = pjVar3->bytes_in_buffer;
  }
  else {
    pbVar14 = pjVar3->next_input_byte + 1;
  }
  uVar8 = (ulong)bVar1 * 0x100;
  local_38 = uVar8 | *pbVar14;
  local_48 = uVar8 + *pbVar14 + -2;
  uVar8 = 0;
  uVar5 = 0;
  if (2 < local_38) {
    uVar5 = (uint)local_48;
  }
  uVar15 = 0xe;
  if (local_38 < 0x10) {
    uVar15 = uVar5;
  }
  pbVar14 = pbVar14 + 1;
  sVar13 = sVar13 - 1;
  pjVar12 = local_40;
  if (uVar15 != 0) {
    uVar8 = (ulong)uVar15;
    uVar9 = 0;
    do {
      if (sVar13 == 0) {
        bVar4 = (*pjVar3->fill_input_buffer)(pjVar12);
        if (bVar4 == 0) {
          return 0;
        }
        pbVar14 = pjVar3->next_input_byte;
        sVar13 = pjVar3->bytes_in_buffer;
        pjVar12 = local_40;
      }
      *(byte *)((long)&local_58 + uVar9) = *pbVar14;
      uVar9 = uVar9 + 1;
      pbVar14 = pbVar14 + 1;
      sVar13 = sVar13 - 1;
    } while (uVar8 != uVar9);
  }
  lVar10 = local_48 - uVar8;
  iVar2 = pjVar12->unread_marker;
  if (iVar2 == 0xee) {
    if (((0xb < uVar15) && (local_58 == 0x626f6441)) && (local_54 == 'e')) {
      pjVar6 = pjVar12->err;
      *(uint *)&pjVar6->msg_parm = (uint)(ushort)(local_53 << 8 | local_53 >> 8);
      *(uint *)((long)&pjVar6->msg_parm + 4) =
           (uint)(ushort)(CONCAT11(bStack_50,local_51) << 8 | (ushort)bStack_50);
      *(uint *)((long)&pjVar6->msg_parm + 8) =
           (uint)(ushort)(CONCAT11(bStack_4e,bStack_4f) << 8 | (ushort)bStack_4e);
      *(uint *)((long)&pjVar6->msg_parm + 0xc) = (uint)bStack_4d;
      pjVar6->msg_code = 0x4e;
      (*pjVar6->emit_message)((j_common_ptr)pjVar12,1);
      pjVar12->saw_Adobe_marker = 1;
      pjVar12->Adobe_transform = bStack_4d;
      goto LAB_00106f36;
    }
    pjVar6 = pjVar12->err;
    pjVar6->msg_code = 0x50;
    (pjVar6->msg_parm).i[0] = uVar15 + (int)lVar10;
  }
  else {
    if (iVar2 != 0xe0) {
      pjVar6 = pjVar12->err;
      pjVar6->msg_code = 0x46;
      (pjVar6->msg_parm).i[0] = iVar2;
      (*pjVar12->err->error_exit)((j_common_ptr)pjVar12);
      goto LAB_00106f36;
    }
    if (uVar15 < 0xe) {
      if (((uVar15 < 6) || ((char)local_58 != 'J')) || (local_58._1_1_ != 'F')) goto LAB_00106f19;
LAB_00106ecb:
      if (((local_58._2_1_ != 'X') || (local_58._3_1_ != 'X')) || (local_54 != '\0'))
      goto LAB_00106f19;
      pjVar6 = pjVar12->err;
      if ((byte)local_53 == 0x13) {
        pjVar6->msg_code = 0x70;
      }
      else if ((byte)local_53 == 0x11) {
        pjVar6->msg_code = 0x6f;
      }
      else {
        if ((byte)local_53 != 0x10) {
          pjVar6->msg_code = 0x5b;
          (pjVar6->msg_parm).i[0] = (uint)(byte)local_53;
          (pjVar12->err->msg_parm).i[1] = (int)local_48;
          goto LAB_00106f2b;
        }
        pjVar6->msg_code = 0x6e;
      }
    }
    else {
      if ((char)local_58 == 'J') {
        if ((local_58._3_1_ == 'F' && (local_58._2_1_ == 'I' && local_58._1_1_ == 'F')) &&
            local_54 == '\0') {
          pjVar12->saw_JFIF_marker = 1;
          pjVar12->JFIF_major_version = (byte)local_53;
          pjVar12->JFIF_minor_version = local_53._1_1_;
          pjVar12->density_unit = local_51;
          uVar7 = CONCAT11(bStack_4f,bStack_50) << 8 | (ushort)bStack_4f;
          pjVar12->X_density = uVar7;
          uVar11 = CONCAT11(bStack_4d,bStack_4e) << 8 | (ushort)bStack_4d;
          pjVar12->Y_density = uVar11;
          uVar5 = 1;
          local_48 = lVar10;
          if ((byte)local_53 != 1) {
            pjVar6 = pjVar12->err;
            pjVar6->msg_code = 0x7a;
            (pjVar6->msg_parm).i[0] = (uint)(byte)local_53;
            *(uint *)((long)&pjVar12->err->msg_parm + 4) = (uint)pjVar12->JFIF_minor_version;
            (*pjVar12->err->emit_message)((j_common_ptr)pjVar12,-1);
            uVar5 = (uint)local_40->JFIF_major_version;
            local_53._1_1_ = local_40->JFIF_minor_version;
            local_51 = local_40->density_unit;
            uVar7 = local_40->X_density;
            uVar11 = local_40->Y_density;
            pjVar12 = local_40;
          }
          pjVar6 = pjVar12->err;
          (pjVar6->msg_parm).i[0] = uVar5;
          *(uint *)((long)&pjVar6->msg_parm + 4) = (uint)local_53._1_1_;
          *(uint *)((long)&pjVar6->msg_parm + 8) = (uint)uVar7;
          *(uint *)((long)&pjVar6->msg_parm + 0xc) = (uint)uVar11;
          *(uint *)((long)&pjVar6->msg_parm + 0x10) = (uint)local_51;
          pjVar6->msg_code = 0x59;
          (*pjVar6->emit_message)((j_common_ptr)pjVar12,1);
          if (local_4b != 0 || local_4c != 0) {
            pjVar6 = pjVar12->err;
            pjVar6->msg_code = 0x5c;
            *(uint *)&pjVar6->msg_parm = (uint)local_4c;
            *(uint *)((long)&pjVar12->err->msg_parm + 4) = (uint)local_4b;
            (*pjVar12->err->emit_message)((j_common_ptr)pjVar12,1);
          }
          lVar10 = local_48;
          if (local_38 - 0x10 == (ulong)local_4b * (ulong)local_4c * 3) goto LAB_00106f36;
          pjVar6 = local_40->err;
          pjVar6->msg_code = 0x5a;
          (pjVar6->msg_parm).i[0] = (int)(local_38 - 0x10);
          pjVar12 = local_40;
          goto LAB_00106f2b;
        }
        if (local_58._1_1_ == 'F') goto LAB_00106ecb;
      }
LAB_00106f19:
      pjVar6 = pjVar12->err;
      pjVar6->msg_code = 0x4f;
    }
    (pjVar6->msg_parm).i[0] = (int)local_48;
  }
LAB_00106f2b:
  (*pjVar12->err->emit_message)((j_common_ptr)pjVar12,1);
LAB_00106f36:
  pjVar3->next_input_byte = pbVar14;
  pjVar3->bytes_in_buffer = sVar13;
  if (0 < lVar10) {
    (*local_40->src->skip_input_data)(local_40,lVar10);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
get_interesting_appn (j_decompress_ptr cinfo)
/* Process an APP0 or APP14 marker without saving it */
{
  INT32 length;
  JOCTET b[APPN_DATA_LEN];
  unsigned int i, numtoread;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  /* get the interesting part of the marker data */
  if (length >= APPN_DATA_LEN)
    numtoread = APPN_DATA_LEN;
  else if (length > 0)
    numtoread = (unsigned int) length;
  else
    numtoread = 0;
  for (i = 0; i < numtoread; i++)
    INPUT_BYTE(cinfo, b[i], return FALSE);
  length -= numtoread;

  /* process it */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  case M_APP14:
    examine_app14(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  default:
    /* can't get here unless jpeg_save_markers chooses wrong processor */
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}